

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86ATTInstPrinter.c
# Opt level: O0

void printPCRelImm(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  uint8_t uVar3;
  MCInst *MI_00;
  int64_t iVar4;
  SStream *O_00;
  uint8_t *puVar5;
  undefined8 in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t access [6];
  uint8_t opsize;
  int64_t imm;
  MCOperand *Op;
  undefined8 in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  uint id;
  undefined4 in_stack_fffffffffffffff0;
  
  id = (uint)((ulong)in_RDX >> 0x20);
  MI_00 = (MCInst *)MCInst_getOperand(in_RDI,in_ESI);
  _Var2 = MCOperand_isImm((MCOperand *)MI_00);
  if (_Var2) {
    iVar4 = MCOperand_getImm((MCOperand *)MI_00);
    O_00 = (SStream *)(iVar4 + (ulong)in_RDI->flat_insn->size + in_RDI->address);
    uVar3 = X86_immediate_size(in_RDI->Opcode,(uint8_t *)0x0);
    if (in_RDI->csh->mode != CS_MODE_64) {
      O_00 = (SStream *)((ulong)O_00 & 0xffffffff);
    }
    if (((in_RDI->csh->mode == CS_MODE_16) && (in_RDI->Opcode != 0x460)) &&
       (in_RDI->Opcode != 0x169)) {
      O_00 = (SStream *)((ulong)O_00 & 0xffff);
    }
    if (((in_RDI->csh->mode == CS_MODE_16) && (in_RDI->Opcode == 0x460)) &&
       (in_RDI->x86_prefix[2] != 'f')) {
      O_00 = (SStream *)((ulong)O_00 & 0xffff);
    }
    if ((in_RDI->Opcode == 0x168) || (in_RDI->Opcode == 0x45f)) {
      O_00 = (SStream *)((ulong)O_00 & 0xffff);
    }
    printImm(MI_00,O_00,CONCAT17(uVar3,in_stack_ffffffffffffffd0),
             SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      puVar5 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x55;
      puVar5[0] = '\x02';
      puVar5[1] = '\0';
      puVar5[2] = '\0';
      puVar5[3] = '\0';
      if ((in_RDI->flat_insn->detail->field_6).x86.op_count == '\0') {
        if (uVar3 == '\0') {
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] =
               in_RDI->imm_size;
        }
        else {
          in_RDI->flat_insn->detail->groups
          [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] = uVar3;
        }
      }
      else {
        in_RDI->flat_insn->detail->groups
        [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x75] =
             *(uint8_t *)((long)&in_RDI->flat_insn->detail->field_6 + 0x68);
      }
      *(SStream **)
       (in_RDI->flat_insn->detail->groups +
       (ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x5d) = O_00;
      MCInst_getOpcode(in_RDI);
      get_op_access((cs_struct *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),id,(uint8_t *)MI_00,
                    (uint64_t *)O_00);
      in_RDI->flat_insn->detail->groups
      [(ulong)(in_RDI->flat_insn->detail->field_6).x86.op_count * 0x30 + 0x76] =
           (&stack0xffffffffffffffd1)[(in_RDI->flat_insn->detail->field_6).x86.op_count];
      pcVar1 = in_RDI->flat_insn->detail;
      (pcVar1->field_6).x86.op_count = (pcVar1->field_6).x86.op_count + '\x01';
    }
    if (in_RDI->op1_size == '\0') {
      in_RDI->op1_size = in_RDI->imm_size;
    }
  }
  return;
}

Assistant:

static void printPCRelImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op) + MI->flat_insn->size + MI->address;

		// truncat imm for non-64bit
		if (MI->csh->mode != CS_MODE_64) {
			imm = imm & 0xffffffff;
		}

		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode != X86_JMP_4 && MI->Opcode != X86_CALLpcrel32))
			imm = imm & 0xffff;

		// Hack: X86 16bit with opcode X86_JMP_4
		if (MI->csh->mode == CS_MODE_16 &&
				(MI->Opcode == X86_JMP_4 && MI->x86_prefix[2] != 0x66))
			imm = imm & 0xffff;

		// CALL/JMP rel16 is special
		if (MI->Opcode == X86_CALLpcrel16 || MI->Opcode == X86_JMP_2)
			imm = imm & 0xffff;

		if (imm < 0) {
			SStream_concat(O, "0x%"PRIx64, imm);
		} else {
			if (imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%"PRIx64, imm);
			else
				SStream_concat(O, "%"PRIu64, imm);
		}
		if (MI->csh->detail) {
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].type = X86_OP_IMM;
			MI->has_imm = true;
			MI->flat_insn->detail->x86.operands[MI->flat_insn->detail->x86.op_count].imm = imm;
			MI->flat_insn->detail->x86.op_count++;
		}
	}
}